

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

adiak_datatype_t *
parse_typestr_helper
          (char *typestr,int typestr_start,int typestr_end,int is_reference,va_list *ap,
          int *new_typestr_start)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  void *pvVar6;
  adiak_datatype_t *paVar7;
  int *piVar8;
  adiak_datatype_t **ppaVar9;
  adiak_datatype_t *paVar10;
  int iVar11;
  char *pcVar12;
  adiak_datatype_t *paVar13;
  int iVar14;
  char cVar15;
  va_list *pa_Var16;
  long lVar17;
  bool bVar18;
  int local_54;
  ulong local_50;
  va_list *local_48;
  int *local_40;
  long local_38;
  
  if (typestr_start == typestr_end || typestr == (char *)0x0) {
    return (adiak_datatype_t *)0x0;
  }
  local_48 = ap;
  local_40 = new_typestr_start;
  ppuVar5 = __ctype_b_loc();
  pcVar12 = typestr + typestr_start;
  do {
    do {
      cVar15 = *pcVar12;
      typestr_start = typestr_start + 1;
      pcVar12 = pcVar12 + 1;
    } while ((long)cVar15 == 0x2c);
  } while (((*ppuVar5)[cVar15] & 0x2000) != 0);
  bVar18 = cVar15 == '&';
  local_50 = (ulong)bVar18;
  if (bVar18) {
    is_reference = 1;
  }
  iVar14 = (bVar18 - 1) + typestr_start;
  local_38 = (long)iVar14;
  bVar1 = typestr[local_38];
  pvVar6 = memchr("[{<(",(int)(char)bVar1,5);
  if (pvVar6 == (void *)0x0) {
    paVar7 = (adiak_datatype_t *)0x0;
  }
  else {
    paVar7 = (adiak_datatype_t *)calloc(1,0x20);
  }
  if (0x3b < bVar1) {
    if (bVar1 == 0x3c) {
      iVar14 = find_end_brace(typestr,'>',iVar14,typestr_end);
      if (iVar14 != -1) {
        paVar7->dtype = adiak_range;
        paVar7->numerical = adiak_categorical;
        paVar7->is_reference = is_reference;
        paVar7->num_elements = (uint)(is_reference == 0) * 2;
        paVar7->num_ref_elements = (uint)(is_reference != 0) * 2;
        paVar7->num_subtypes = 1;
        ppaVar9 = (adiak_datatype_t **)malloc(8);
        paVar7->subtype = ppaVar9;
        iVar4 = (int)local_50;
        pa_Var16 = local_48;
LAB_00107544:
        paVar10 = parse_typestr_helper
                            (typestr,iVar4 + typestr_start,iVar14,is_reference,pa_Var16,&local_54);
        *paVar7->subtype = paVar10;
        if (*paVar7->subtype != (adiak_datatype_t *)0x0) {
          *local_40 = iVar14 + 1;
          return paVar7;
        }
        goto LAB_00107662;
      }
    }
    else {
      if ((bVar1 != 0x7b) && (bVar1 != 0x5b)) {
        return paVar7;
      }
      iVar14 = find_end_brace(typestr,(bVar1 == 0x7b) << 5 | 0x5d,iVar14,typestr_end);
      pa_Var16 = local_48;
      if (iVar14 != -1) {
        uVar2 = (*local_48)[0].gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar8 = (int *)((ulong)uVar2 + (long)(*local_48)[0].reg_save_area);
          (*local_48)[0].gp_offset = uVar2 + 8;
        }
        else {
          piVar8 = (int *)(*local_48)[0].overflow_arg_area;
          (*local_48)[0].overflow_arg_area = piVar8 + 2;
        }
        iVar4 = *piVar8;
        iVar11 = 0;
        if (is_reference == 0) {
          iVar11 = iVar4;
        }
        paVar7->num_elements = iVar11;
        if (is_reference == 0) {
          iVar4 = 0;
        }
        paVar7->num_ref_elements = iVar4;
        paVar7->dtype = (typestr[local_38] == '{') + adiak_set;
        paVar7->numerical = adiak_categorical;
        paVar7->is_reference = is_reference;
        paVar7->num_subtypes = 1;
        ppaVar9 = (adiak_datatype_t **)malloc(8);
        paVar7->subtype = ppaVar9;
        iVar4 = (int)local_50;
        goto LAB_00107544;
      }
    }
    goto switchD_00107641_caseD_65;
  }
  if (bVar1 != 0x25) {
    if (bVar1 != 0x28) {
      return paVar7;
    }
    iVar14 = find_end_brace(typestr,')',iVar14,typestr_end);
    if (iVar14 == -1) goto switchD_00107641_caseD_65;
    paVar7->dtype = adiak_tuple;
    paVar7->numerical = adiak_categorical;
    paVar7->is_reference = is_reference;
    uVar2 = (*local_48)[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar8 = (int *)((ulong)uVar2 + (long)(*local_48)[0].reg_save_area);
      (*local_48)[0].gp_offset = uVar2 + 8;
    }
    else {
      piVar8 = (int *)(*local_48)[0].overflow_arg_area;
      (*local_48)[0].overflow_arg_area = piVar8 + 2;
    }
    iVar4 = *piVar8;
    iVar11 = iVar4;
    iVar3 = 0;
    if (is_reference == 0) {
      iVar11 = 0;
      iVar3 = iVar4;
    }
    paVar7->num_elements = iVar3;
    paVar7->num_ref_elements = iVar11;
    paVar7->num_subtypes = iVar4;
    ppaVar9 = (adiak_datatype_t **)calloc(1,(long)iVar4 * 8);
    pa_Var16 = local_48;
    local_54 = (int)local_50 + typestr_start;
    paVar7->subtype = ppaVar9;
    if ((long)iVar4 < 1) {
      return paVar7;
    }
    lVar17 = 0;
    while( true ) {
      paVar10 = parse_typestr_helper(typestr,local_54,iVar14,is_reference,pa_Var16,&local_54);
      paVar7->subtype[lVar17] = paVar10;
      if (paVar7->subtype[lVar17] == (adiak_datatype_t *)0x0) break;
      lVar17 = lVar17 + 1;
      if (paVar7->num_subtypes <= lVar17) {
        return paVar7;
      }
    }
    goto LAB_00107662;
  }
  iVar14 = (int)local_50;
  iVar4 = iVar14 + typestr_start;
  cVar15 = typestr[iVar4];
  if (cVar15 == 'l') {
    iVar4 = iVar14 + typestr_start + 1;
    cVar15 = typestr[iVar4];
    if (cVar15 == 'l') {
      iVar4 = iVar14 + typestr_start + 2;
      cVar15 = typestr[iVar4];
      paVar13 = &base_ulonglong;
      paVar10 = &base_longlong;
    }
    else {
      paVar13 = &base_ulong;
      paVar10 = &base_long;
    }
  }
  else {
    paVar13 = &base_uint;
    paVar10 = &base_int;
  }
  switch(cVar15) {
  case 'd':
    goto switchD_00107641_caseD_64;
  case 'e':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
    goto switchD_00107641_caseD_65;
  case 'f':
    paVar10 = &base_double;
    goto switchD_00107641_caseD_64;
  case 'p':
    paVar7 = &base_path;
    paVar10 = &base_path_ref;
    break;
  case 'r':
    paVar7 = &base_catstring;
    paVar10 = &base_catstring_ref;
    break;
  case 's':
    paVar7 = &base_string;
    paVar10 = &base_string_ref;
    break;
  case 't':
    paVar10 = &base_timeval;
    goto switchD_00107641_caseD_64;
  case 'u':
    paVar10 = paVar13;
    goto switchD_00107641_caseD_64;
  case 'v':
    paVar7 = &base_version;
    paVar10 = &base_version_ref;
    break;
  default:
    if (cVar15 == 'D') {
      paVar10 = &base_date;
      goto switchD_00107641_caseD_64;
    }
    goto switchD_00107641_caseD_65;
  }
  if (is_reference == 0) {
    paVar10 = paVar7;
  }
switchD_00107641_caseD_64:
  *local_40 = iVar4 + 1;
  return paVar10;
switchD_00107641_caseD_65:
  if (paVar7 != (adiak_datatype_t *)0x0) {
LAB_00107662:
    free_adiak_type(paVar7);
  }
  return (adiak_datatype_t *)0x0;
}

Assistant:

static adiak_datatype_t *parse_typestr_helper(const char *typestr, int typestr_start, int typestr_end, int is_reference,
                                       va_list *ap, int *new_typestr_start)

{
   adiak_datatype_t *t = NULL;
   int cur = typestr_start;
   int end_brace, i;
   int is_long = 0, is_longlong = 0;

   if (!typestr)
      goto error;
   if (typestr_start == typestr_end)
      goto error;

   while (isspace(typestr[cur]) || typestr[cur] == ',')
      cur++;
   if (typestr[cur] == '&') {
      is_reference = 1;
      cur++;
   }

   if (strchr("[{<(", typestr[cur])) {
      t = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
      memset(t, 0, sizeof(*t));
   }
   if (typestr[cur] == '{' || typestr[cur] == '[') {
      end_brace = find_end_brace(typestr, typestr[cur] == '{' ? '}' : ']',
                                 cur, typestr_end);
      if (end_brace == -1)
         goto error;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->dtype = typestr[cur] == '{' ? adiak_list : adiak_set;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '<') {
      end_brace = find_end_brace(typestr, '>', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_range;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_elements = (is_reference ? 0 : 2);
      t->num_ref_elements = (is_reference ? 2 : 0);
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '(') {
      end_brace = find_end_brace(typestr, ')', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_tuple;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->num_subtypes = num_elements;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * t->num_subtypes);
      memset(t->subtype, 0, sizeof(adiak_datatype_t *) * t->num_subtypes);
      cur++;
      for (i = 0; i < t->num_subtypes; i++) {
         t->subtype[i] = parse_typestr_helper(typestr, cur, end_brace, is_reference, ap, &cur);
         if (!t->subtype[i])
            goto error;
      }
   }
   else if (typestr[cur] == '%') {
      cur++;
      if (typestr[cur] == 'l') {
         is_long = 1;
         cur++;
         if (typestr[cur] == 'l') {
            is_longlong = 1;
            cur++;
         }
      }
      switch (typestr[cur]) {
         case 'd':
            t = is_long ? (is_longlong ? &base_longlong  : &base_long)  : &base_int;
            break;
         case 'u':
            t = is_long ? (is_longlong ? &base_ulonglong : &base_ulong) : &base_uint;
            break;
         case 'f':
            t = &base_double;
            break;
         case 'D':
            t = &base_date;
            break;
         case 't':
            t = &base_timeval;
            break;
         case 'v':
            t = (is_reference ? &base_version_ref : &base_version);
            break;
         case 's':
            t = (is_reference ? &base_string_ref : &base_string);
            break;
         case 'r':
            t = (is_reference ? &base_catstring_ref : &base_catstring);
            break;
         case 'p':
            t = (is_reference ? &base_path_ref : &base_path);
            break;
         default:
            goto error;
      }
      cur++;
      *new_typestr_start = cur;
      goto done;
   }

  done:
   return t;
  error:
   if (t)
      free_adiak_type(t);
   return NULL;
}